

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

size_t __thiscall PClassActor::PropagateMark(PClassActor *this)

{
  BYTE *pBVar1;
  size_t sVar2;
  long lVar3;
  int i;
  long lVar4;
  
  lVar3 = 8;
  for (lVar4 = 0; lVar4 < this->NumOwnedStates; lVar4 = lVar4 + 1) {
    if (*(long *)((long)&this->OwnedStates->NextState + lVar3) != 0) {
      GC::Mark<VMFunction>((VMFunction **)((long)&this->OwnedStates->NextState + lVar3));
    }
    lVar3 = lVar3 + 0x28;
  }
  pBVar1 = (this->super_PClass).Defaults;
  if (pBVar1 != (BYTE *)0x0) {
    GC::Mark<VMFunction>((VMFunction **)(pBVar1 + 0x1b0));
  }
  sVar2 = PStruct::PropagateMark((PStruct *)this);
  return sVar2;
}

Assistant:

size_t PClassActor::PropagateMark()
{
	// Mark state functions
	for (int i = 0; i < NumOwnedStates; ++i)
	{
		if (OwnedStates[i].ActionFunc != NULL)
		{
			GC::Mark(OwnedStates[i].ActionFunc);
		}
	}
	// Mark damage function
	if (Defaults != NULL)
	{
		GC::Mark(((AActor *)Defaults)->DamageFunc);
	}

//	marked += ActorInfo->NumOwnedStates * sizeof(FState);
	return Super::PropagateMark();
}